

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

void __thiscall FReader::FReader(FReader *this,char *buffer,size_t length)

{
  Document *this_00;
  Document doc;
  FJSONObject local_a0;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_88;
  
  (this->mObjects).Array = (FJSONObject *)0x0;
  (this->mObjects).Most = 0;
  (this->mObjects).Count = 0;
  this_00 = &this->mDoc;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(this_00,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  this->mObjectsRead = false;
  (this->mDObjects).Array = (DObject **)0x0;
  (this->mDObjects).Most = 0;
  (this->mDObjects).Count = 0;
  this->mKeyValue = (Value *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_88,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<16u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)this_00,buffer,length);
  FJSONObject::FJSONObject
            (&local_a0,
             &this_00->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            );
  TArray<FJSONObject,_FJSONObject>::Push(&this->mObjects,&local_a0);
  this->mPlayers[4] = -1;
  this->mPlayers[5] = -1;
  this->mPlayers[6] = -1;
  this->mPlayers[7] = -1;
  this->mPlayers[0] = -1;
  this->mPlayers[1] = -1;
  this->mPlayers[2] = -1;
  this->mPlayers[3] = -1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_88);
  return;
}

Assistant:

FReader(const char *buffer, size_t length)
	{
		rapidjson::Document doc;
		mDoc.Parse(buffer, length);
		mObjects.Push(FJSONObject(&mDoc));
		memset(mPlayers, -1, sizeof(mPlayers));
	}